

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_search.cpp
# Opt level: O2

void __thiscall
ANNkd_tree::annkSearch
          (ANNkd_tree *this,ANNpoint q,int k,ANNidxArray nn_idx,ANNdistArray dd,double eps)

{
  double *pdVar1;
  int *piVar2;
  ANNkd_ptr pAVar3;
  mk_node *pmVar4;
  double *pdVar5;
  int *piVar6;
  ANNmin_k *pAVar7;
  ulong uVar8;
  long lVar9;
  ANNidx AVar10;
  ulong uVar11;
  long lVar12;
  ANNdist AVar13;
  
  ANNkdDim = this->dim;
  lVar12 = (long)ANNkdDim;
  uVar8 = lVar12 * 8;
  if (lVar12 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  uVar11 = lVar12 * 4;
  if (lVar12 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar8);
  ANNScale = pdVar5;
  piVar6 = (int *)operator_new__(uVar11);
  pdVar1 = this->Scale;
  piVar2 = this->Topology;
  ANNTopology = piVar6;
  for (lVar9 = 0; lVar9 < lVar12; lVar9 = lVar9 + 1) {
    pdVar5[lVar9] = pdVar1[lVar9];
    piVar6[lVar9] = piVar2[lVar9];
  }
  ANNkdPts = this->pts;
  ANNptsVisited = 0;
  ANNkdQ = q;
  if (this->n_pts < k) {
    annError("Requesting more near neighbors than data points",ANNabort);
  }
  ANNkdMaxErr = (eps + 1.0) * (eps + 1.0);
  pAVar7 = (ANNmin_k *)operator_new(0x10);
  ANNmin_k::ANNmin_k(pAVar7,k);
  pAVar3 = this->root;
  ANNkdPointMK = pAVar7;
  annBoxDistance(q,this->bnd_box_lo,this->bnd_box_hi,this->dim,ANNScale,ANNTopology);
  (*pAVar3->_vptr_ANNkd_node[2])(pAVar3);
  pAVar7 = ANNkdPointMK;
  uVar8 = 0;
  if (k < 1) {
    k = 0;
  }
  lVar12 = 1;
  for (; (uint)k != uVar8; uVar8 = uVar8 + 1) {
    AVar13 = 1.79769313486232e+308;
    AVar10 = -1;
    if ((long)uVar8 < (long)pAVar7->n) {
      pmVar4 = pAVar7->mk;
      AVar13 = *(ANNdist *)((long)pmVar4 + lVar12 * 8 + -8);
      AVar10 = *(ANNidx *)(&pmVar4->key + lVar12);
    }
    dd[uVar8] = AVar13;
    nn_idx[uVar8] = AVar10;
    lVar12 = lVar12 + 2;
  }
  if (ANNScale != (double *)0x0) {
    operator_delete__(ANNScale);
  }
  if (ANNTopology != (int *)0x0) {
    operator_delete__(ANNTopology);
  }
  pAVar7 = ANNkdPointMK;
  if (ANNkdPointMK != (ANNmin_k *)0x0) {
    ANNmin_k::~ANNmin_k(ANNkdPointMK);
  }
  operator_delete(pAVar7);
  return;
}

Assistant:

void ANNkd_tree::annkSearch(
    ANNpoint q,          // the query point
    int k,               // number of near neighbors to return
    ANNidxArray nn_idx,  // nearest neighbor indices (returned)
    ANNdistArray dd,     // the approximate nearest neighbor
    double eps)          // the error bound
{
    ANNkdDim = dim;  // copy arguments to static equivs
    ANNScale = new double[dim];
    ANNTopology = new int[dim];
    for (int i = 0; i < dim; i++) {
        ANNScale[i] = Scale[i];
        ANNTopology[i] = Topology[i];
    }
    ANNkdQ = q;
    ANNkdPts = pts;
    ANNptsVisited = 0;  // initialize count of points visited

    if (k > n_pts) {  // too many near neighbors?
        annError("Requesting more near neighbors than data points", ANNabort);
    }

    ANNkdMaxErr = ANN_POW(1.0 + eps);
    //    FLOP(2)				// increment floating op count

    ANNkdPointMK = new ANNmin_k(k);  // create set for closest k points
                                     // search starting at the root
    root->ann_search(
        annBoxDistance(q, bnd_box_lo, bnd_box_hi, dim, ANNScale, ANNTopology));

    for (int i = 0; i < k; i++) {  // extract the k-th closest points
        dd[i] = ANNkdPointMK->ith_smallest_key(i);
        nn_idx[i] = ANNkdPointMK->ith_smallest_info(i);
    }
    delete[] ANNScale;
    delete[] ANNTopology;
    delete ANNkdPointMK;  // deallocate closest point set
}